

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Type> * __thiscall
wasm::Random::FeatureOptions<wasm::Type>::
add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
          (FeatureOptions<wasm::Type> *this,FeatureSet feature,WeightedOption weightedOption,
          WeightedOption rest,WeightedOption rest_1,WeightedOption rest_2)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type> *pFVar1;
  size_t i;
  ulong uVar2;
  WeightedOption weightedOption_00;
  value_type local_50;
  WeightedOption weightedOption_local;
  FeatureSet local_34 [2];
  FeatureSet feature_local;
  
  weightedOption_local.weight = rest.weight;
  weightedOption_local.option.id = weightedOption.weight;
  local_50.id = (uintptr_t)weightedOption.option.id;
  local_34[0].features = feature.features;
  for (uVar2 = 0; uVar2 < weightedOption_local.option.id; uVar2 = uVar2 + 1) {
    this_00 = std::
              map<wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
              ::operator[](&this->options,local_34);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back(this_00,&local_50);
  }
  weightedOption_00.weight = weightedOption_local.weight;
  weightedOption_00.option.id = rest.option.id.id;
  pFVar1 = add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
                     (this,local_34[0],weightedOption_00,rest_1,rest_2);
  return pFVar1;
}

Assistant:

FeatureOptions<T>&
    add(FeatureSet feature, WeightedOption weightedOption, Ts... rest) {
      for (size_t i = 0; i < weightedOption.weight; i++) {
        options[feature].push_back(weightedOption.option);
      }
      return add(feature, rest...);
    }